

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

int quicly_sendbuf_write(quicly_stream_t *stream,quicly_sendbuf_t *sb,void *src,size_t len)

{
  int iVar1;
  quicly_sendbuf_t *sb_00;
  quicly_stream_t *in_RCX;
  void *in_RDX;
  long in_RDI;
  int ret;
  quicly_sendbuf_vec_t vec;
  int local_44;
  quicly_stream_t *stream_00;
  
  stream_00 = in_RCX;
  iVar1 = quicly_sendstate_is_open((quicly_sendstate_t *)(in_RDI + 0x18));
  if (iVar1 == 0) {
    __assert_fail("quicly_sendstate_is_open(&stream->sendstate)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0x8a,
                  "int quicly_sendbuf_write(quicly_stream_t *, quicly_sendbuf_t *, const void *, size_t)"
                 );
  }
  sb_00 = (quicly_sendbuf_t *)malloc((size_t)stream_00);
  if (sb_00 == (quicly_sendbuf_t *)0x0) {
    local_44 = 0x201;
  }
  else {
    memcpy(sb_00,in_RDX,(size_t)stream_00);
    local_44 = quicly_sendbuf_write_vec(stream_00,sb_00,(quicly_sendbuf_vec_t *)in_RCX);
    if (local_44 == 0) {
      return 0;
    }
  }
  free(sb_00);
  return local_44;
}

Assistant:

int quicly_sendbuf_write(quicly_stream_t *stream, quicly_sendbuf_t *sb, const void *src, size_t len)
{
    static const quicly_streambuf_sendvec_callbacks_t raw_callbacks = {flatten_raw, discard_raw};
    quicly_sendbuf_vec_t vec = {&raw_callbacks, len, NULL};
    int ret;

    assert(quicly_sendstate_is_open(&stream->sendstate));

    if ((vec.cbdata = malloc(len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    memcpy(vec.cbdata, src, len);
    if ((ret = quicly_sendbuf_write_vec(stream, sb, &vec)) != 0)
        goto Error;
    return 0;

Error:
    free(vec.cbdata);
    return ret;
}